

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void __thiscall
duckdb::ArgMinMaxBase<duckdb::LessThan,true>::
Execute<int,duckdb::hugeint_t,duckdb::ArgMinMaxState<int,duckdb::hugeint_t>>
          (ArgMinMaxBase<duckdb::LessThan,true> *this,ArgMinMaxState<int,_duckdb::hugeint_t> *state,
          int x_data,hugeint_t y_data,AggregateBinaryInput *binary)

{
  uint64_t uVar1;
  undefined4 in_register_00000014;
  
  uVar1 = y_data.lower;
  if (((long)uVar1 < (long)*(uint64_t *)(this + 0x10)) ||
     (CONCAT44(in_register_00000014,x_data) < *(ulong *)(this + 8) &&
      *(uint64_t *)(this + 0x10) == uVar1)) {
    TemplatedValidityMask<unsigned_long>::RowIsValid
              (*(TemplatedValidityMask<unsigned_long> **)(y_data.upper + 8),
               *(idx_t *)(y_data.upper + 0x18));
    *(int *)(this + 4) = (int)state;
    *(ulong *)(this + 8) = CONCAT44(in_register_00000014,x_data);
    *(uint64_t *)(this + 0x10) = uVar1;
  }
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}